

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool qIsBlob(enum_field_types t)

{
  undefined1 local_5;
  enum_field_types t_local;
  
  local_5 = true;
  if ((((t != MYSQL_TYPE_TINY_BLOB) && (local_5 = true, t != MYSQL_TYPE_BLOB)) &&
      (local_5 = true, t != MYSQL_TYPE_MEDIUM_BLOB)) && (local_5 = true, t != MYSQL_TYPE_LONG_BLOB))
  {
    local_5 = t == MYSQL_TYPE_JSON;
  }
  return local_5;
}

Assistant:

static bool qIsBlob(enum_field_types t)
{
    return t == MYSQL_TYPE_TINY_BLOB
           || t == MYSQL_TYPE_BLOB
           || t == MYSQL_TYPE_MEDIUM_BLOB
           || t == MYSQL_TYPE_LONG_BLOB
           || t == MYSQL_TYPE_JSON;
}